

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O2

QRect __thiscall
QItemDelegate::doCheck
          (QItemDelegate *this,QStyleOptionViewItem *option,QRect *bounding,QVariant *value)

{
  long lVar1;
  QWidget *this_00;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QRect QVar3;
  QStyleOptionButton opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(ulong *)&(value->d).field_0x18 < 4) {
    QVar3 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  }
  else {
    opt.icon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.iconSize = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    opt.text.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    opt.text.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.text.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionButton::QStyleOptionButton(&opt);
    QStyleOption::operator=(&opt.super_QStyleOption,&option->super_QStyleOption);
    opt.super_QStyleOption.rect.x1.m_i = (bounding->x1).m_i;
    opt.super_QStyleOption.rect.y1.m_i = (bounding->y1).m_i;
    opt.super_QStyleOption.rect.x2.m_i = (bounding->x2).m_i;
    opt.super_QStyleOption.rect.y2.m_i = (bounding->y2).m_i;
    this_00 = option->widget;
    if (this_00 == (QWidget *)0x0) {
      pQVar2 = QApplication::style();
    }
    else {
      pQVar2 = QWidget::style(this_00);
    }
    QVar3 = (QRect)(**(code **)(*(long *)pQVar2 + 0xc0))(pQVar2,0x17,&opt,this_00);
    QStyleOptionButton::~QStyleOptionButton(&opt);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QRect QItemDelegate::doCheck(const QStyleOptionViewItem &option,
                           const QRect &bounding, const QVariant &value) const
{
    if (value.isValid()) {
        Q_D(const QItemDelegate);
        QStyleOptionButton opt;
        opt.QStyleOption::operator=(option);
        opt.rect = bounding;
        const QWidget *widget = d->widget(option); // cast
        QStyle *style = widget ? widget->style() : QApplication::style();
        return style->subElementRect(QStyle::SE_ItemViewItemCheckIndicator, &opt, widget);
    }
    return QRect();
}